

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.cpp
# Opt level: O2

void embree::storeSTB(Ref<embree::Image> *img,FileName *fileName)

{
  uint x_00;
  uint y;
  bool bVar1;
  runtime_error *this;
  int x;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 uVar6;
  float fVar7;
  Color4 c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  string ext;
  
  FileName::ext_abi_cxx11_((string *)&c,fileName);
  toLowerCase(&ext,(string *)&c);
  std::__cxx11::string::~string((string *)&c);
  bVar1 = std::operator!=(&ext,"bmp");
  if (((bVar1) && (bVar1 = std::operator!=(&ext,"png"), bVar1)) &&
     (bVar1 = std::operator!=(&ext,"jpg"), bVar1)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Could not store image");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  x_00 = (uint)img->ptr->width;
  y = (uint)img->ptr->height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pixels,(long)((ulong)(x_00 * y) * 0x300000000) >> 0x20,(allocator_type *)&c);
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)x_00) {
    uVar3 = (ulong)x_00;
  }
  uVar5 = 0;
  if (0 < (int)y) {
    uVar5 = (ulong)y;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      (*(img->ptr->super_RefCount)._vptr_RefCount[4])(&c,img->ptr,uVar2,uVar4);
      uVar6 = c.field_0.m128[0];
      if (1.0 <= c.field_0.m128[0]) {
        uVar6 = 1.0;
      }
      fVar7 = 0.0;
      if (0.0 <= (float)uVar6) {
        fVar7 = (float)uVar6;
      }
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[(img->ptr->width * uVar4 + uVar2) * 3] =
           (uchar)(int)(fVar7 * 255.0);
      uVar6 = c.field_0.m128[1];
      if (1.0 <= c.field_0.m128[1]) {
        uVar6 = 1.0;
      }
      fVar7 = 0.0;
      if (0.0 <= (float)uVar6) {
        fVar7 = (float)uVar6;
      }
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[(img->ptr->width * uVar4 + uVar2) * 3 + 1] =
           (uchar)(int)(fVar7 * 255.0);
      uVar6 = c.field_0.m128[2];
      if (1.0 <= c.field_0.m128[2]) {
        uVar6 = 1.0;
      }
      fVar7 = 0.0;
      if (0.0 <= (float)uVar6) {
        fVar7 = (float)uVar6;
      }
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[(img->ptr->width * uVar4 + uVar2) * 3 + 2] =
           (uchar)(int)(fVar7 * 255.0);
    }
  }
  bVar1 = std::operator==(&ext,"bmp");
  if (bVar1) {
    std::__cxx11::string::string((string *)&c,(string *)fileName);
    stbi_write_bmp((char *)CONCAT44(c.field_0.m128[1],c.field_0.m128[0]),x_00,y,3,
                   pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  }
  else {
    bVar1 = std::operator==(&ext,"png");
    if (bVar1) {
      std::__cxx11::string::string((string *)&c,(string *)fileName);
      stbi_write_png((char *)CONCAT44(c.field_0.m128[1],c.field_0.m128[0]),x_00,y,3,
                     pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,x_00 * 3);
    }
    else {
      bVar1 = std::operator==(&ext,"jpg");
      if (!bVar1) goto LAB_0019fd55;
      std::__cxx11::string::string((string *)&c,(string *)fileName);
      stbi_write_jpg((char *)CONCAT44(c.field_0.m128[1],c.field_0.m128[0]),x_00,y,3,
                     pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,100);
    }
  }
  std::__cxx11::string::~string((string *)&c);
LAB_0019fd55:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

void storeSTB(const Ref<Image>& img, const FileName& fileName)
  {
    std::string ext = toLowerCase(fileName.ext());
    if (ext != "bmp" && ext != "png" && ext != "jpg") {
        THROW_RUNTIME_ERROR("Could not store image")
        return;
    }

    int width = int(img->width);
    int height = int(img->height);
    int channels = 3;
    std::vector<unsigned char> pixels(width*height*channels);
    const float maxColor = 255.f;
    for (int y = 0; y < height; y++)
    {
      for (int x = 0; x < width; x++)
      {
        Color4 c = img->get(x, y);
        pixels[(y*img->width+x)*channels+0] = (unsigned char)(clamp(c.r) * maxColor);
        pixels[(y*img->width+x)*channels+1] = (unsigned char)(clamp(c.g) * maxColor);
        pixels[(y*img->width+x)*channels+2] = (unsigned char)(clamp(c.b) * maxColor);
      }
    }

    if (ext == "bmp" ) { stbi_write_bmp(fileName.str().c_str(), width, height, channels, pixels.data());                    return; }
    if (ext == "png" ) { stbi_write_png(fileName.str().c_str(), width, height, channels, pixels.data(), width * channels);  return; }
    if (ext == "jpg" ) { stbi_write_jpg(fileName.str().c_str(), width, height, channels, pixels.data(), 100);               return; }
  }